

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O1

void __thiscall
helics::Endpoint::setCallback
          (Endpoint *this,
          function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
          *callback)

{
  MessageFederate *this_00;
  _Any_data _Stack_38;
  _Manager_type local_28;
  
  this_00 = this->fed;
  if (this_00 != (MessageFederate *)0x0) {
    std::function<void(helics::Endpoint&,TimeRepresentation<count_time<9,long>>)>::
    function<std::function<void(helics::Endpoint_const&,TimeRepresentation<count_time<9,long>>)>const&,void>
              ((function<void(helics::Endpoint&,TimeRepresentation<count_time<9,long>>)> *)
               _Stack_38._M_pod_data,callback);
    helics::MessageFederate::setMessageNotificationCallback
              (this_00,this,
               (function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
               &_Stack_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
    }
  }
  return;
}

Assistant:

void Endpoint::setCallback(const std::function<void(const Endpoint&, Time)>& callback)
{
    if (fed != nullptr) {
        fed->setMessageNotificationCallback(*this, callback);
    }
}